

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O0

void __thiscall gutil::Properties::save(Properties *this,char *name,char *comment)

{
  _Ios_Iostate __a;
  _Ios_Openmode in_ESI;
  failure *ex;
  ofstream out;
  char *comment_00;
  undefined4 in_stack_fffffffffffffdac;
  Properties *in_stack_fffffffffffffdb0;
  long local_218 [65];
  _Ios_Openmode local_10;
  
  local_10 = in_ESI;
  std::ofstream::ofstream(local_218);
  comment_00 = (char *)((long)local_218 + *(long *)(local_218[0] + -0x18));
  __a = std::operator|(_S_failbit,_S_badbit);
  std::operator|(__a,_S_eofbit);
  std::ios::exceptions((_Ios_Iostate)comment_00);
  std::ofstream::open((char *)local_218,local_10);
  save(in_stack_fffffffffffffdb0,(ostream *)CONCAT44(in_stack_fffffffffffffdac,__a),comment_00);
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void Properties::save(const char *name, const char *comment) const
{
  std::ofstream out;

  try
  {
    out.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
    out.open(name);

    save(out, comment);

    out.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw IOException(ex.what());
  }
}